

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# dconnected.cpp
# Opt level: O0

void __thiscall FilteredLT::DFS(FilteredLT *this,int r)

{
  bool bVar1;
  undefined4 in_ESI;
  long in_RDI;
  int in_stack_0000002c;
  LengauerTarjan *in_stack_00000030;
  undefined4 in_stack_fffffffffffffff0;
  
  GraphPropagator::getNodeVar
            ((GraphPropagator *)CONCAT44(in_ESI,in_stack_fffffffffffffff0),
             (int)((ulong)in_RDI >> 0x20));
  bVar1 = BoolView::isFixed((BoolView *)0x2ab8ee);
  if (bVar1) {
    GraphPropagator::getNodeVar
              ((GraphPropagator *)CONCAT44(in_ESI,in_stack_fffffffffffffff0),
               (int)((ulong)in_RDI >> 0x20));
    bVar1 = BoolView::isTrue((BoolView *)CONCAT44(in_ESI,in_stack_fffffffffffffff0));
    if (bVar1) {
      *(int *)(in_RDI + 0xf8) = *(int *)(in_RDI + 0xf8) + 1;
    }
  }
  LengauerTarjan::DFS(in_stack_00000030,in_stack_0000002c);
  return;
}

Assistant:

void FilteredLT::DFS(int r) {
	if (DEBUG) {
		std::cout << "DFS Visiting " << r << " " << p->getNodeVar(r).isFixed()
							<< ((p->getNodeVar(r).isFixed()) ? static_cast<int>(p->getNodeVar(r).isTrue()) : -1)
							<< '\n';
	}
	if (p->getNodeVar(r).isFixed() && p->getNodeVar(r).isTrue()) {
		visited_innodes++;
	}
	LengauerTarjan::DFS(r);
}